

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O3

void __thiscall QUndoStack::beginMacro(QUndoStack *this,QString *text)

{
  int iVar1;
  long lVar2;
  QUndoCommand *pQVar3;
  QArrayData *this_00;
  iterator iVar4;
  qsizetype i;
  QPodArrayOps<QUndoCommand*> *this_01;
  long in_FS_OFFSET;
  QArrayData *local_68;
  void **ppvStack_60;
  undefined8 local_58;
  void *local_48;
  undefined1 *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  this_00 = (QArrayData *)operator_new(0x10);
  QUndoCommand::QUndoCommand((QUndoCommand *)this_00,(QUndoCommand *)0x0);
  QUndoCommand::setText((QUndoCommand *)this_00,text);
  if (*(long *)(lVar2 + 0xa0) == 0) {
    this_01 = (QPodArrayOps<QUndoCommand*> *)(lVar2 + 0x78);
    i = *(long *)(lVar2 + 0x88);
    iVar1 = *(int *)(lVar2 + 0xa8);
    while (iVar1 < i) {
      iVar4 = QList<QUndoCommand_*>::end((QList<QUndoCommand_*> *)this_01);
      pQVar3 = iVar4.i[-1];
      i = *(long *)(lVar2 + 0x88) + -1;
      *(qsizetype *)(lVar2 + 0x88) = i;
      if (pQVar3 != (QUndoCommand *)0x0) {
        (*pQVar3->_vptr_QUndoCommand[1])();
        i = *(long *)(lVar2 + 0x88);
      }
      iVar1 = *(int *)(lVar2 + 0xa8);
    }
    if (iVar1 < *(int *)(lVar2 + 0xac)) {
      *(undefined4 *)(lVar2 + 0xac) = 0xffffffff;
    }
  }
  else {
    this_01 = *(QPodArrayOps<QUndoCommand*> **)
               (*(long *)(*(long *)(lVar2 + 0x98) + -8 + *(long *)(lVar2 + 0xa0) * 8) + 8);
    i = *(qsizetype *)(this_01 + 0x10);
  }
  local_68 = this_00;
  QtPrivate::QPodArrayOps<QUndoCommand*>::emplace<QUndoCommand*&>
            (this_01,i,(QUndoCommand **)&local_68);
  QList<QUndoCommand_*>::end((QList<QUndoCommand_*> *)this_01);
  local_68 = this_00;
  QtPrivate::QPodArrayOps<QUndoCommand*>::emplace<QUndoCommand*&>
            ((QPodArrayOps<QUndoCommand*> *)(lVar2 + 0x90),*(qsizetype *)(lVar2 + 0xa0),
             (QUndoCommand **)&local_68);
  QList<QUndoCommand_*>::end((QList<QUndoCommand_*> *)(lVar2 + 0x90));
  if (*(long *)(lVar2 + 0xa0) == 1) {
    ppvStack_60 = &local_48;
    local_48 = (void *)((ulong)local_48 & 0xffffffffffffff00);
    local_68 = (QArrayData *)0x0;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,2,&local_68);
    local_58 = 0;
    local_68 = (QArrayData *)0x0;
    ppvStack_60 = (void **)0x0;
    local_48 = (void *)0x0;
    local_40 = (undefined1 *)&local_68;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,4,&local_48);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
    local_48 = (void *)((ulong)local_48 & 0xffffffffffffff00);
    local_68 = (QArrayData *)0x0;
    ppvStack_60 = &local_48;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,3,&local_68);
    local_58 = 0;
    local_68 = (QArrayData *)0x0;
    ppvStack_60 = (void **)0x0;
    local_48 = (void *)0x0;
    local_40 = (undefined1 *)&local_68;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,5,&local_48);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoStack::beginMacro(const QString &text)
{
    Q_D(QUndoStack);
    QUndoCommand *cmd = new QUndoCommand();
    cmd->setText(text);

    if (d->macro_stack.isEmpty()) {
        while (d->index < d->command_list.size())
            delete d->command_list.takeLast();
        if (d->clean_index > d->index)
            d->clean_index = -1; // we've deleted the clean state
        d->command_list.append(cmd);
    } else {
        d->macro_stack.constLast()->d->child_list.append(cmd);
    }
    d->macro_stack.append(cmd);

    if (d->macro_stack.size() == 1) {
        emit canUndoChanged(false);
        emit undoTextChanged(QString());
        emit canRedoChanged(false);
        emit redoTextChanged(QString());
    }
}